

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O1

bool __thiscall
Volume::Intersect(Volume *this,Ray *ray,float t_min,float t_max,hit_record_t *hit_record)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  hit_record_t _hit_record_1;
  hit_record_t _hit_record_2;
  float local_a0 [12];
  undefined8 local_70;
  float local_68;
  Vec3 local_64;
  float local_58 [12];
  
  iVar3 = (*this->m_object->_vptr_Object[2])(0xff7fffff,0x7f7fffff,this->m_object,ray,local_a0);
  if (((char)iVar3 != '\0') &&
     (iVar3 = (*this->m_object->_vptr_Object[2])
                        ((ulong)(uint)(local_a0[0] + 0.0001),0x7f7fffff,this->m_object,ray,local_58)
     , (char)iVar3 != '\0')) {
    if (t_min <= local_a0[0]) {
      t_min = local_a0[0];
    }
    if (local_58[0] <= t_max) {
      t_max = local_58[0];
    }
    if (t_min < t_max) {
      fVar4 = (ray->m_direction).e[0];
      fVar1 = (ray->m_direction).e[1];
      fVar7 = (ray->m_direction).e[2];
      fVar4 = fVar7 * fVar7 + fVar4 * fVar4 + fVar1 * fVar1;
      local_a0[0] = t_min;
      local_58[0] = t_max;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      fVar1 = this->m_density;
      dVar6 = drand48();
      fVar5 = logf((float)dVar6);
      fVar7 = local_a0[0];
      fVar5 = fVar5 * (-1.0 / fVar1);
      if (fVar5 < (t_max - t_min) * fVar4) {
        fVar4 = (ray->m_direction).e[0];
        fVar1 = (ray->m_direction).e[1];
        fVar2 = (ray->m_direction).e[2];
        fVar4 = fVar2 * fVar2 + fVar4 * fVar4 + fVar1 * fVar1;
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        fVar7 = fVar7 + fVar5 / fVar4;
        hit_record->m_t = fVar7;
        operator*(fVar7,&local_64);
        operator+(&ray->m_origin,&local_64);
        (hit_record->m_point).e[2] = local_68;
        *(undefined8 *)(hit_record->m_point).e = local_70;
        (hit_record->m_normal).e[0] = 1.0;
        (hit_record->m_normal).e[1] = 0.0;
        (hit_record->m_normal).e[2] = 0.0;
        hit_record->m_material = this->m_material;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
Volume::Intersect(const Ray& ray, float t_min, float t_max, hit_record_t& hit_record) const
{
	hit_record_t _hit_record_1, _hit_record_2;
	if(m_object->Intersect(ray, -std::numeric_limits<float>::max(), std::numeric_limits<float>::max(), _hit_record_1) &&
	   m_object->Intersect(ray,     _hit_record_1.m_t + RT_RAY_STEP, std::numeric_limits<float>::max(), _hit_record_2)
	  ) {

		_hit_record_1.m_t = std::max(_hit_record_1.m_t, t_min);
		_hit_record_2.m_t = std::min(_hit_record_2.m_t, t_max);
		if(_hit_record_1.m_t >= _hit_record_2.m_t) {
			return false;
		}

		float _distance_in_object = (_hit_record_2.m_t - _hit_record_1.m_t)*ray.GetDirection().length();
		float _hit_distance		  = -(1.0f / m_density)*std::log(RANDOM_GEN());
		if(_hit_distance < _distance_in_object) {
			hit_record.m_t        = _hit_record_1.m_t + _hit_distance/ray.GetDirection().length();
			hit_record.m_point    = ray.GetPoint(hit_record.m_t);
			hit_record.m_normal   = Vec3(1.0f,0.0f,0.0f);
			hit_record.m_material = m_material;
			return true;
		}
	}

    return false;
}